

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall Clasp::Solver::estimateBCP(Solver *this,Literal *p,int rd)

{
  ValueRep VVar1;
  bool bVar2;
  uint n;
  Var VVar3;
  uint32 uVar4;
  uint32 uVar5;
  const_reference pLVar6;
  int in_EDX;
  ShortImplicationsGraph *in_RSI;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RDI;
  Literal x;
  uint32 maxIdx;
  ShortImplicationsGraph *btig;
  Solver *self;
  size_type i;
  size_type first;
  undefined4 in_stack_ffffffffffffff98;
  ValueRep val;
  Var in_stack_ffffffffffffff9c;
  Solver *in_stack_ffffffffffffffa0;
  Assignment *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  Literal local_40;
  uint32 local_3c;
  ImpGraphRef local_38;
  uint32 uVar7;
  int iVar8;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *ppVar9;
  uint32 local_4;
  
  val = (ValueRep)((uint)in_stack_ffffffffffffff98 >> 0x18);
  ppVar9 = in_RDI;
  Literal::var((Literal *)in_RSI);
  VVar1 = value(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if (VVar1 == '\0') {
    n = Assignment::assigned((Assignment *)0x1ebd38);
    this_00 = (Assignment *)&in_RDI[0xc].ebo_.size;
    uVar7 = n;
    VVar3 = Literal::var((Literal *)in_RSI);
    trueValue((Literal *)0x1ebd78);
    Assignment::setValue(this_00,in_stack_ffffffffffffff9c,val);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (in_RDI,(Literal *)CONCAT44(VVar3,in_stack_ffffffffffffffa8));
    local_38 = SharedContext::shortImplications(*(SharedContext **)&in_RDI[6].ebo_.size);
    local_3c = ShortImplicationsGraph::size((ShortImplicationsGraph *)0x1ebdbc);
    do {
      uVar4 = n + 1;
      pLVar6 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          &in_RDI[0xc].ebo_.size,n);
      local_40.rep_ = pLVar6->rep_;
      uVar5 = Literal::id(&local_40);
      iVar8 = in_EDX;
      if ((uVar5 < local_3c) &&
         (bVar2 = ShortImplicationsGraph::propagateBin
                            (in_RSI,(Assignment *)CONCAT44(in_EDX,uVar7),(Literal)(uint32)ppVar9,
                             uVar4), iVar8 = in_EDX, !bVar2)) break;
      n = uVar4;
      uVar5 = Assignment::assigned((Assignment *)0x1ebe38);
      in_EDX = iVar8;
      if (uVar4 < uVar5) {
        in_EDX = iVar8 + -1;
      }
    } while (uVar4 < uVar5 && iVar8 != 0);
    local_4 = Assignment::assigned((Assignment *)0x1ebe7b);
    local_4 = local_4 - uVar7;
    while (uVar4 = Assignment::assigned((Assignment *)0x1ebe94), uVar4 != uVar7) {
      Assignment::undoLast(this_00);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32 Solver::estimateBCP(const Literal& p, int rd) const {
	if (value(p.var()) != value_free) return 0;
	LitVec::size_type first = assign_.assigned();
	LitVec::size_type i     = first;
	Solver& self            = const_cast<Solver&>(*this);
	self.assign_.setValue(p.var(), trueValue(p));
	self.assign_.trail.push_back(p);
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	do {
		Literal x = assign_.trail[i++];
		if (x.id() < maxIdx && !btig.propagateBin(self.assign_, x, 0)) {
			break;
		}
	} while (i < assign_.assigned() && rd-- != 0);
	i = assign_.assigned()-first;
	while (self.assign_.assigned() != first) {
		self.assign_.undoLast();
	}
	return (uint32)i;
}